

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_delete.cpp
# Opt level: O1

unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true> __thiscall
duckdb::Transformer::TransformDelete(Transformer *this,PGDeleteStmt *stmt)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  PGList *list;
  undefined8 uVar3;
  DeleteStatement *this_00;
  pointer pDVar4;
  pointer pTVar5;
  InvalidInputException *this_01;
  long in_RDX;
  pointer *__ptr_2;
  pointer *__ptr;
  undefined8 *puVar6;
  optional_ptr<duckdb_libpgquery::PGNode,_true> target;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> using_entry;
  undefined1 local_58 [32];
  optional_ptr<duckdb::Transformer,_true> local_38;
  
  this_00 = (DeleteStatement *)operator_new(0x108);
  DeleteStatement::DeleteStatement(this_00);
  (this->parent).ptr = (Transformer *)this_00;
  if (*(Transformer **)(in_RDX + 0x28) != (Transformer *)0x0) {
    local_58._0_8_ = *(Transformer **)(in_RDX + 0x28);
    optional_ptr<duckdb_libpgquery::PGWithClause,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)local_58);
    uVar3 = local_58._0_8_;
    pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
             ::operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                           *)this);
    TransformCTE((Transformer *)stmt,(PGWithClause *)uVar3,&pDVar4->cte_map);
  }
  TransformExpression((Transformer *)local_58,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>::
           operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                       *)this);
  uVar3 = local_58._0_8_;
  local_58._0_8_ = (Transformer *)0x0;
  _Var1._M_head_impl =
       (pDVar4->condition).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pDVar4->condition).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)uVar3
  ;
  if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((Transformer *)local_58._0_8_ != (Transformer *)0x0) {
    (**(code **)(*(long *)local_58._0_8_ + 8))();
  }
  TransformRangeVar((Transformer *)local_58,(PGRangeVar *)stmt);
  pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>::
           operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                       *)this);
  uVar3 = local_58._0_8_;
  local_58._0_8_ = (Transformer *)0x0;
  _Var2._M_head_impl =
       (pDVar4->table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pDVar4->table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar3;
  if (_Var2._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
  }
  if ((Transformer *)local_58._0_8_ != (Transformer *)0x0) {
    (**(code **)(*(long *)local_58._0_8_ + 8))();
  }
  pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>::
           operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                       *)this);
  pTVar5 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     (&pDVar4->table);
  if (pTVar5->type == BASE_TABLE) {
    if ((*(long *)(in_RDX + 0x10) != 0) &&
       (puVar6 = *(undefined8 **)(*(long *)(in_RDX + 0x10) + 8), puVar6 != (undefined8 *)0x0)) {
      do {
        local_58._0_8_ = *puVar6;
        optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGNode,_true> *)local_58);
        TransformTableRefNode((Transformer *)&stack0xffffffffffffffc8,(PGNode *)stmt);
        pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                 ::operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                               *)this);
        ::std::
        vector<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>>
                    *)&pDVar4->using_clauses,
                   (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   &stack0xffffffffffffffc8);
        if (local_38.ptr != (Transformer *)0x0) {
          (*(code *)(((local_38.ptr)->parent).ptr)->options)();
        }
        puVar6 = (undefined8 *)puVar6[1];
      } while (puVar6 != (undefined8 *)0x0);
    }
    list = *(PGList **)(in_RDX + 0x20);
    if (list != (PGList *)0x0) {
      pDVar4 = unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
               ::operator->((unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>,_true>
                             *)this);
      TransformExpressionList((Transformer *)stmt,list,&pDVar4->returning_list);
    }
    return (unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>_>)
           (unique_ptr<duckdb::DeleteStatement,_std::default_delete<duckdb::DeleteStatement>_>)this;
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_58._0_8_ = local_58 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Can only delete from base tables!","");
  InvalidInputException::InvalidInputException(this_01,(string *)local_58);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<DeleteStatement> Transformer::TransformDelete(duckdb_libpgquery::PGDeleteStmt &stmt) {
	auto result = make_uniq<DeleteStatement>();
	if (stmt.withClause) {
		TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), result->cte_map);
	}

	result->condition = TransformExpression(stmt.whereClause);
	result->table = TransformRangeVar(*stmt.relation);
	if (result->table->type != TableReferenceType::BASE_TABLE) {
		throw InvalidInputException("Can only delete from base tables!");
	}
	if (stmt.usingClause) {
		for (auto n = stmt.usingClause->head; n != nullptr; n = n->next) {
			auto target = PGPointerCast<duckdb_libpgquery::PGNode>(n->data.ptr_value);
			auto using_entry = TransformTableRefNode(*target);
			result->using_clauses.push_back(std::move(using_entry));
		}
	}

	if (stmt.returningList) {
		TransformExpressionList(*stmt.returningList, result->returning_list);
	}

	return result;
}